

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imageadapter.h
# Opt level: O0

void __thiscall
bgui::ImageAdapter<unsigned_char>::ImageAdapter
          (ImageAdapter<unsigned_char> *this,
          Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *im,double valid_min,
          double valid_max,bool delete_on_close)

{
  long lVar1;
  long lVar2;
  byte in_DL;
  long in_RSI;
  long *in_RDI;
  undefined8 in_R9;
  long in_XMM0_Qa;
  long in_XMM1_Qa;
  ImageAdapterBase *in_stack_ffffffffffffffb0;
  long *plVar3;
  
  ImageAdapterBase::ImageAdapterBase(in_stack_ffffffffffffffb0);
  *in_RDI = (long)&PTR__ImageAdapter_001c4fb0;
  plVar3 = in_RDI + 0x12;
  std::
  vector<gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>,_std::allocator<gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>_>_>
  ::vector((vector<gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>,_std::allocator<gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>_>_>
            *)0x1422f5);
  in_RDI[0xe] = in_RSI;
  *(byte *)(in_RDI + 0xf) = in_DL & 1;
  in_RDI[0x10] = in_XMM0_Qa;
  in_RDI[0x11] = in_XMM1_Qa;
  lVar1 = gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getWidth
                    ((Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)in_RDI[0xe]);
  lVar2 = gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getHeight
                    ((Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *)in_RDI[0xe]);
  (**(code **)(*in_RDI + 0x20))(in_RDI,0,0,lVar1,lVar2,in_R9,lVar2,plVar3);
  return;
}

Assistant:

ImageAdapter(const gimage::Image<T> *im, double valid_min=-std::numeric_limits<float>::max(),
                 double valid_max=std::numeric_limits<float>::max(), bool delete_on_close=false)
    {
      image=im;
      del=delete_on_close;

      vmin=valid_min;
      vmax=valid_max;

      adaptMinMaxIntensity(0, 0, image->getWidth(), image->getHeight());
    }